

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::EntryRaw(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  RecyclableObject *instance;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  ulong uVar8;
  JavascriptString *pJVar9;
  uint64 uVar10;
  uint64 uVar11;
  uint uVar12;
  uint idxArg;
  int64 j;
  ulong uVar13;
  uint32 index;
  double value;
  int in_stack_00000010;
  undefined1 local_2a0 [8];
  Builder<256U> stringBuilder;
  CallInfo callInfo_local;
  RecyclableObject *callSite;
  undefined1 local_60 [8];
  ArgumentReader args;
  Var rawVar;
  RecyclableObject *local_38;
  RecyclableObject *raw;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  stringBuilder._544_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x616,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d1558c;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_60,(CallInfo *)&stringBuilder.isFinalized)
  ;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((stringBuilder._544_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x619,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d1558c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)local_60 & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_60,1);
    BVar4 = JavascriptConversion::ToObject(pvVar7,pSVar1,(RecyclableObject **)&callInfo_local);
    if (BVar4 != 0) {
      iVar5 = (**(code **)(*(long *)callInfo_local + 0x90))
                        (callInfo_local,callInfo_local,0x12a,&args.super_Arguments.Values,0,pSVar1);
      if (iVar5 != 1) {
        args.super_Arguments.Values =
             (Type)(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      BVar4 = JavascriptConversion::ToObject(args.super_Arguments.Values,pSVar1,&local_38);
      if (BVar4 != 0) {
        pvVar7 = JavascriptOperators::OP_GetLength(local_38,pSVar1);
        uVar8 = JavascriptConversion::ToLength(pvVar7,pSVar1);
        if ((long)uVar8 < 1) {
          pJVar9 = JavascriptLibrary::GetEmptyString
                             ((pSVar1->super_ScriptContextBase).javascriptLibrary);
        }
        else {
          pvVar7 = JavascriptOperators::OP_GetElementI_UInt32(local_38,0,pSVar1);
          pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
          if (uVar8 != 1) {
            CompoundString::Builder<256U>::Builder((Builder<256U> *)local_2a0,pSVar1);
            if (stringBuilder._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (pJVar9,(Builder<256U> *)local_2a0,false);
            }
            else {
              CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
            }
            uVar12 = local_60._0_4_ & 0xffffff;
            uVar13 = 0xfffffffe;
            if (uVar8 < 0xfffffffe) {
              uVar13 = uVar8;
            }
            index = 1;
            do {
              idxArg = index + 1;
              if (idxArg < uVar12) {
                pvVar7 = Arguments::operator[]((Arguments *)local_60,idxArg);
                pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
                if (stringBuilder._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (pJVar9,(Builder<256U> *)local_2a0,false);
                }
                else {
                  CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
                }
              }
              pvVar7 = JavascriptOperators::OP_GetElementI_UInt32(local_38,index,pSVar1);
              pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
              if (stringBuilder._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (pJVar9,(Builder<256U> *)local_2a0,false);
              }
              else {
                CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
              }
              index = idxArg;
            } while ((uint)uVar13 != idxArg);
            if ((long)uVar13 < (long)uVar8) {
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              do {
                instance = local_38;
                if ((long)(int)uVar13 == uVar13) {
                  pvVar7 = (Var)(uVar13 & 0xffffffff | 0x1000000000000);
                }
                else {
                  value = (double)(long)uVar13;
                  uVar10 = NumberUtilities::ToSpecial(value);
                  bVar3 = NumberUtilities::IsNan(value);
                  if (((bVar3) &&
                      (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)) &&
                     (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                                ,0xa2,
                                                "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                                ,"We should only produce a NaN with this value");
                    if (!bVar3) goto LAB_00d1558c;
                    *puVar6 = 0;
                  }
                  pvVar7 = (Var)(uVar10 ^ 0xfffc000000000000);
                }
                pvVar7 = JavascriptOperators::OP_GetElementI(instance,pvVar7,pSVar1);
                pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
                if (stringBuilder._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (pJVar9,(Builder<256U> *)local_2a0,false);
                }
                else {
                  CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
                }
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
            pJVar9 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_2a0);
          }
        }
        return pJVar9;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"String.raw");
}

Assistant:

Var JavascriptString::EntryRaw(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        RecyclableObject* callSite;
        RecyclableObject* raw;
        Var rawVar;

        // Call ToObject on the first argument to get the callSite (which is also cooked string array)
        // ToObject returns false if the parameter is null or undefined
        if (!JavascriptConversion::ToObject(args[1], scriptContext, &callSite))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        // Get the raw property from the callSite object
        if (!callSite->GetProperty(callSite, Js::PropertyIds::raw, &rawVar, nullptr, scriptContext))
        {
            rawVar = scriptContext->GetLibrary()->GetUndefined();
        }

        if (!JavascriptConversion::ToObject(rawVar, scriptContext, &raw))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        int64 length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(raw, scriptContext), scriptContext);

        // If there are no raw strings (somehow), return empty string
        if (length <= 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Get the first raw string
        Var var = JavascriptOperators::OP_GetElementI_UInt32(raw, 0, scriptContext);
        JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);

        // If there is only one raw string, just return that one raw string (doesn't matter if there are replacements)
        if (length == 1)
        {
            return string;
        }

        // We aren't going to bail early so let's create a StringBuilder and put the first raw string in there
        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> stringBuilder(scriptContext);
        stringBuilder.Append(string);

        // Each raw string is followed by a substitution expression except for the last one
        // We will always have one more string constant than substitution expression
        // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
        //
        // strcon1 --- step 1 (above)
        // expr1   \__ step 2
        // strcon2 /
        // expr2   \__ step 3
        // strcon3 /
        const auto append = [&] (Var var)
        {
            JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);
                stringBuilder.Append(string);
        };
        uint32 loopMax = length >= UINT_MAX ? UINT_MAX-1 : (uint32)length;
        uint32 i = 1;
        uint32 argsCount = args.Info.Count;
        for (; i < loopMax; ++i)
        {
            // First append the next substitution expression if available
            if (i + 1 < argsCount)
            {
                append(args[i + 1]);
            }

            // Then append the next string (this will also cover the final string case)
            append(JavascriptOperators::OP_GetElementI_UInt32(raw, i, scriptContext));
        }

        // Length can be greater than uint32 max (unlikely in practice)
        for (int64 j = (int64)i; j < length; ++j)
        {
            // Append whatever is left in the array/object
            append(JavascriptOperators::OP_GetElementI(raw, JavascriptNumber::ToVar(j, scriptContext), scriptContext));
        }

        // CompoundString::Builder has saved our lives
        return stringBuilder.ToString();
    }